

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_err_t array_list_init(int init_size,array_list_t *array_list)

{
  ion_err_t iVar1;
  ion_fpos_t *piVar2;
  
  array_list->current_size = init_size;
  piVar2 = (ion_fpos_t *)calloc(1,(long)init_size << 3);
  array_list->data = piVar2;
  iVar1 = '\x06';
  if (piVar2 != (ion_fpos_t *)0x0) {
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
array_list_init(
	int				init_size,
	array_list_t	*array_list
) {
	array_list->current_size	= init_size;
	array_list->data			= malloc(init_size * sizeof(ion_fpos_t));
	memset(array_list->data, 0, sizeof(ion_fpos_t) * init_size);

	if (NULL == array_list->data) {
		return err_out_of_memory;
	}

	return err_ok;
}